

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chull.cpp
# Opt level: O3

void masc::polygon::hull2d
               (ply_vertex *s,ply_vertex *e,
               list<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_> *hull
               )

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  int iVar3;
  int iVar4;
  _Self __tmp_2;
  undefined4 extraout_var;
  _List_node_base *p_Var5;
  undefined4 extraout_var_00;
  _List_node_base *p_Var6;
  double *pdVar7;
  double *pdVar8;
  double *pdVar9;
  _Self __tmp;
  _Self __tmp_1;
  
  iVar3 = (*e->_vptr_ply_vertex[3])(e);
  p_Var5 = (_List_node_base *)operator_new(0x18);
  p_Var5[1]._M_next = (_List_node_base *)s;
  std::__detail::_List_node_base::_M_hook(p_Var5);
  psVar1 = &(hull->
            super__List_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>
            )._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  iVar4 = (*s->_vptr_ply_vertex[3])(s);
  p_Var5 = (_List_node_base *)operator_new(0x18);
  p_Var5[1]._M_next = (_List_node_base *)CONCAT44(extraout_var_00,iVar4);
  std::__detail::_List_node_base::_M_hook(p_Var5);
  psVar1 = &(hull->
            super__List_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>
            )._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  p_Var5 = (hull->
           super__List_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>
           )._M_impl._M_node.super__List_node_base._M_prev;
  p_Var6 = (_List_node_base *)operator_new(0x18);
  p_Var6[1]._M_next = p_Var5[1]._M_next;
  std::__detail::_List_node_base::_M_hook(p_Var6);
  psVar1 = &(hull->
            super__List_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>
            )._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  p_Var5 = (_List_node_base *)
           (*(code *)((hull->
                      super__List_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>
                      )._M_impl._M_node.super__List_node_base._M_prev[1]._M_next)->_M_next[1].
                     _M_prev)();
  do {
    if (p_Var5 == (_List_node_base *)CONCAT44(extraout_var,iVar3)) {
      p_Var5 = (hull->
               super__List_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>
               )._M_impl._M_node.super__List_node_base._M_prev;
      psVar1 = &(hull->
                super__List_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>
                )._M_impl._M_node._M_size;
      *psVar1 = *psVar1 - 1;
      std::__detail::_List_node_base::_M_unhook();
      operator_delete(p_Var5);
      return;
    }
    p_Var6 = (hull->
             super__List_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>
             )._M_impl._M_node.super__List_node_base._M_prev;
    pdVar7 = (double *)(*(code *)(p_Var6->_M_prev[1]._M_next)->_M_next[1]._M_next)();
    pdVar8 = (double *)(*(code *)(p_Var6[1]._M_next)->_M_next[1]._M_next)();
    pdVar9 = (double *)(*(code *)p_Var5->_M_next[1]._M_next)(p_Var5);
    if ((pdVar9[1] - pdVar8[1]) * (*pdVar8 - *pdVar7) -
        (*pdVar9 - *pdVar8) * (pdVar8[1] - pdVar7[1]) <= 0.0) {
LAB_0010bd00:
      while ((hull->
             super__List_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>
             )._M_impl._M_node._M_size != 1) {
        p_Var6 = (hull->
                 super__List_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>
                 )._M_impl._M_node.super__List_node_base._M_prev;
        pdVar7 = (double *)(*(code *)(p_Var6->_M_prev[1]._M_next)->_M_next[1]._M_next)();
        pdVar8 = (double *)(*(code *)(p_Var6[1]._M_next)->_M_next[1]._M_next)();
        pdVar9 = (double *)(*(code *)p_Var5->_M_next[1]._M_next)(p_Var5);
        if (0.0 < (pdVar9[1] - pdVar8[1]) * (*pdVar8 - *pdVar7) -
                  (*pdVar9 - *pdVar8) * (pdVar8[1] - pdVar7[1])) goto LAB_0010bdaa;
        p_Var6 = (hull->
                 super__List_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>
                 )._M_impl._M_node.super__List_node_base._M_prev;
        psVar1 = &(hull->
                  super__List_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>
                  )._M_impl._M_node._M_size;
        *psVar1 = *psVar1 - 1;
        std::__detail::_List_node_base::_M_unhook();
        operator_delete(p_Var6);
      }
LAB_0010be1e:
      p_Var6 = (_List_node_base *)operator_new(0x18);
      p_Var6[1]._M_next = p_Var5;
      std::__detail::_List_node_base::_M_hook(p_Var6);
      psVar1 = &(hull->
                super__List_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>
                )._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      p_Var6 = (_List_node_base *)operator_new(0x18);
      p_Var6[1]._M_next = p_Var5;
      std::__detail::_List_node_base::_M_hook(p_Var6);
      psVar1 = &(hull->
                super__List_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>
                )._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
    }
    else {
      p_Var6 = (hull->
               super__List_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>
               )._M_impl._M_node.super__List_node_base._M_next;
      p_Var2 = p_Var6->_M_next;
      pdVar7 = (double *)(**(code **)((long)(p_Var6[1]._M_next)->_M_next + 0x10))();
      pdVar8 = (double *)(**(code **)(*(long *)p_Var2[1]._M_next + 0x10))();
      pdVar9 = (double *)(*(code *)p_Var5->_M_next[1]._M_next)(p_Var5);
      if ((pdVar9[1] - pdVar8[1]) * (*pdVar8 - *pdVar7) -
          (*pdVar9 - *pdVar8) * (pdVar8[1] - pdVar7[1]) <= 0.0) goto LAB_0010bd00;
    }
    p_Var5 = (_List_node_base *)(*(code *)p_Var5->_M_next[1]._M_prev)(p_Var5);
  } while( true );
LAB_0010bdaa:
  if ((hull->
      super__List_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>).
      _M_impl._M_node._M_size == 1) goto LAB_0010be1e;
  p_Var6 = (hull->
           super__List_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>
           )._M_impl._M_node.super__List_node_base._M_next;
  p_Var2 = p_Var6->_M_next;
  pdVar7 = (double *)(**(code **)((long)(p_Var6[1]._M_next)->_M_next + 0x10))();
  pdVar8 = (double *)(**(code **)(*(long *)p_Var2[1]._M_next + 0x10))();
  pdVar9 = (double *)(*(code *)p_Var5->_M_next[1]._M_next)(p_Var5);
  if (0.0 < (pdVar9[1] - pdVar8[1]) * (*pdVar8 - *pdVar7) -
            (*pdVar9 - *pdVar8) * (pdVar8[1] - pdVar7[1])) goto LAB_0010be1e;
  p_Var6 = (hull->
           super__List_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>
           )._M_impl._M_node.super__List_node_base._M_next;
  psVar1 = &(hull->
            super__List_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>
            )._M_impl._M_node._M_size;
  *psVar1 = *psVar1 - 1;
  std::__detail::_List_node_base::_M_unhook();
  operator_delete(p_Var6);
  goto LAB_0010bdaa;
}

Assistant:

void hull2d(ply_vertex * s, ply_vertex * e, list<ply_vertex*>& hull )
{
    //avoid letting s and e in the bridge
    //if( s->getBridge()!=NULL ) s=s->getBridge()->v2;
    //if( e->getBridge()!=NULL ) e=e->getBridge()->v1;
    ply_vertex * ne=next(e);

    //init the hull
    hull.push_back(s);
    hull.push_back(next(s));
    hull.push_front(hull.back());

    //incrementally create the hull
    ply_vertex * ptr=next(hull.back());
    while(ptr!=ne){

        //check if the ptr is contained in the hull
        if( !inHull(ptr,hull) ){
            updateHullTop(ptr,hull);
            updateHullBot(ptr,hull);
            hull.push_back(ptr);
            hull.push_front(ptr);
        }

        ptr=next(ptr);

    }//end while(ptr!=ne);
    
    hull.pop_back();
}